

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_prepare.cpp
# Opt level: O0

void __thiscall mocker::CodegenPreparation::sortBlocks(CodegenPreparation *this)

{
  __node_base_ptr *this_00;
  FunctionModule *pFVar1;
  unsigned_long uVar2;
  bool bVar3;
  reference puVar4;
  reference pvVar5;
  BasicBlock *this_01;
  InstList *pIVar6;
  const_reference pvVar7;
  element_type *peVar8;
  __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var9;
  element_type *peVar10;
  size_type sVar11;
  size_type sVar12;
  reference puVar13;
  reference this_02;
  size_t sVar14;
  BasicBlockList *pBVar15;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar16;
  byte local_251;
  BasicBlock *bb;
  const_iterator __end2;
  const_iterator __begin2;
  BasicBlockList *__range2;
  unsigned_long cur;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_1;
  BasicBlockList newBBs;
  size_t local_148;
  size_t local_140;
  size_t local_138;
  _Node_iterator_base<unsigned_long,_false> local_130;
  undefined1 local_128;
  size_t local_120;
  size_t local_118;
  size_t local_110;
  shared_ptr<mocker::ir::Ret> local_108;
  BasicBlock *local_f8;
  BasicBlock *elseBB;
  BasicBlock *thenBB;
  undefined1 local_e0;
  size_t local_d8;
  size_t nxt;
  undefined1 local_c8 [8];
  shared_ptr<mocker::ir::Branch> br;
  unsigned_long local_98;
  unsigned_long n;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> order;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  visited;
  vector<unsigned_long,_std::allocator<unsigned_long>_> PreOrder;
  CodegenPreparation *this_local;
  
  LoopInfo::init(&this->loopTree,(EVP_PKEY_CTX *)(this->super_FuncPass).func);
  anon_unknown_1::getPreOrder
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&visited._M_h._M_single_bucket
             ,(this->super_FuncPass).func);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1);
  this_00 = &visited._M_h._M_single_bucket;
  __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  n = (unsigned_long)
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)&n), bVar3) {
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end1);
    local_98 = *puVar4;
    bVar3 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                      ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)&order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,&local_98);
    if ((!bVar3) ||
       (pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1),
       *pvVar5 == local_98)) {
      bVar3 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                        ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)&order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_98);
      if (!bVar3) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&__range1,&local_98);
        pVar16 = std::
                 unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
                 ::emplace<unsigned_long&>
                           ((unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
                             *)&order.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_98);
        br.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             pVar16.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
      }
      this_01 = ir::FunctionModule::getBasicBlock((this->super_FuncPass).func,local_98);
      pIVar6 = ir::BasicBlock::getInsts_abi_cxx11_(this_01);
      pvVar7 = std::__cxx11::
               list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
               ::back(pIVar6);
      ir::dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)local_c8,pvVar7);
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_c8);
      if (bVar3) {
        bVar3 = LoopInfo::isLoopHeader(&this->loopTree,local_98);
        if (bVar3) {
          peVar8 = std::
                   __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_c8);
          p_Var9 = (__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)ir::Branch::getThen(peVar8);
          peVar10 = std::
                    __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var9);
          local_d8 = ir::Label::getID(peVar10);
          std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&__range1,&local_d8);
          pVar16 = std::
                   unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
                   ::emplace<unsigned_long&>
                             ((unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
                               *)&order.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_d8);
          thenBB = (BasicBlock *)pVar16.first.super__Node_iterator_base<unsigned_long,_false>._M_cur
          ;
          local_e0 = pVar16.second;
          nxt._4_4_ = 3;
        }
        else {
          pFVar1 = (this->super_FuncPass).func;
          peVar8 = std::
                   __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_c8);
          p_Var9 = (__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)ir::Branch::getThen(peVar8);
          peVar10 = std::
                    __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var9);
          sVar14 = ir::Label::getID(peVar10);
          elseBB = ir::FunctionModule::getBasicBlock(pFVar1,sVar14);
          pFVar1 = (this->super_FuncPass).func;
          peVar8 = std::
                   __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_c8);
          p_Var9 = (__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)ir::Branch::getElse(peVar8);
          peVar10 = std::
                    __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var9);
          sVar14 = ir::Label::getID(peVar10);
          local_f8 = ir::FunctionModule::getBasicBlock(pFVar1,sVar14);
          pIVar6 = ir::BasicBlock::getInsts_abi_cxx11_(elseBB);
          pvVar7 = std::__cxx11::
                   list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                   ::back(pIVar6);
          ir::dyc<mocker::ir::Ret,std::shared_ptr<mocker::ir::IRInst>const&>
                    ((ir *)&local_108,pvVar7);
          bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_108);
          local_251 = 0;
          if (bVar3) {
            local_110 = ir::BasicBlock::getLabelID(local_f8);
            bVar3 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                              ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                *)&order.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_110);
            local_251 = bVar3 ^ 0xff;
          }
          std::shared_ptr<mocker::ir::Ret>::~shared_ptr(&local_108);
          if ((local_251 & 1) == 0) {
            local_138 = ir::BasicBlock::getLabelID(elseBB);
            bVar3 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                              ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                *)&order.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_138);
            if (((bVar3 ^ 0xffU) & 1) != 0) {
              local_140 = ir::BasicBlock::getLabelID(elseBB);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              emplace_back<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1,
                         &local_140);
              local_148 = ir::BasicBlock::getLabelID(elseBB);
              pVar16 = std::
                       unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       ::emplace<unsigned_long>
                                 ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                   *)&order.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_148)
              ;
              newBBs.
              super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
              _M_impl._M_node._M_size =
                   (size_t)pVar16.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
            }
          }
          else {
            local_118 = ir::BasicBlock::getLabelID(local_f8);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1,&local_118
                      );
            local_120 = ir::BasicBlock::getLabelID(local_f8);
            pVar16 = std::
                     unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     ::emplace<unsigned_long>
                               ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                 *)&order.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_120);
            local_130._M_cur =
                 (__node_type *)pVar16.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
            local_128 = pVar16.second;
          }
          nxt._4_4_ = 0;
        }
      }
      else {
        nxt._4_4_ = 3;
      }
      std::shared_ptr<mocker::ir::Branch>::~shared_ptr((shared_ptr<mocker::ir::Branch> *)local_c8);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1);
  }
  sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1);
  sVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      &visited._M_h._M_single_bucket);
  if (sVar11 != sVar12) {
    __assert_fail("order.size() == PreOrder.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/codegen_prepare.cpp"
                  ,0x5e,"void mocker::CodegenPreparation::sortBlocks()");
  }
  std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::list
            ((list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)&__range1_1);
  __end1_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1);
  cur = (unsigned_long)
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&cur);
    if (!bVar3) {
      pBVar15 = ir::FunctionModule::getMutableBBs_abi_cxx11_((this->super_FuncPass).func);
      std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::operator=
                (pBVar15,(list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                         &__range1_1);
      std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::~list
                ((list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                 &__range1_1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1);
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)&order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &visited._M_h._M_single_bucket);
      return;
    }
    puVar13 = __gnu_cxx::
              __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator*(&__end1_1);
    uVar2 = *puVar13;
    pBVar15 = ir::FunctionModule::getBBs_abi_cxx11_((this->super_FuncPass).func);
    __end2 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
             begin(pBVar15);
    bb = (BasicBlock *)
         std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                   (pBVar15);
    while (bVar3 = std::operator!=(&__end2,(_Self *)&bb), bVar3) {
      this_02 = std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end2);
      sVar14 = ir::BasicBlock::getLabelID(this_02);
      if (sVar14 == uVar2) {
        std::__cxx11::list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>>::
        emplace_back<mocker::ir::BasicBlock_const&>
                  ((list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *)
                   &__range1_1,this_02);
        break;
      }
      std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

void CodegenPreparation::sortBlocks() {
  loopTree.init(func);

  const auto PreOrder = getPreOrder(func);

  std::unordered_set<std::size_t> visited;
  std::vector<std::size_t> order;
  for (auto n : PreOrder) {
    if (isIn(visited, n) && order.back() != n) // can not be scheduled
      continue;

    if (!isIn(visited, n)) {
      order.emplace_back(n);
      visited.emplace(n);
    }

    auto br = ir::dyc<ir::Branch>(func.getBasicBlock(n).getInsts().back());
    if (!br) {
      continue;
    }

    if (loopTree.isLoopHeader(n)) {
      auto nxt = br->getThen()->getID();
      order.emplace_back(nxt);
      visited.emplace(nxt);
      continue;
    }

    auto &thenBB = func.getBasicBlock(br->getThen()->getID());
    auto &elseBB = func.getBasicBlock(br->getElse()->getID());
    if (ir::dyc<ir::Ret>(thenBB.getInsts().back()) &&
        !isIn(visited, elseBB.getLabelID())) {
      order.emplace_back(elseBB.getLabelID());
      visited.emplace(elseBB.getLabelID());
    } else if (!isIn(visited, thenBB.getLabelID())) {
      order.emplace_back(thenBB.getLabelID());
      visited.emplace(thenBB.getLabelID());
    }
  }

  assert(order.size() == PreOrder.size());

  ir::BasicBlockList newBBs;
  for (auto cur : order) {
    for (auto &bb : func.getBBs()) {
      if (bb.getLabelID() != cur)
        continue;
      newBBs.emplace_back(bb);
      break;
    }
  }
  func.getMutableBBs() = std::move(newBBs);
}